

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O0

size_t __thiscall proto2_unittest::TestAllTypesLite::ByteSizeLong(TestAllTypesLite *this)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  type_conflict tVar4;
  type_conflict tVar5;
  int32_t iVar6;
  uint32_t uVar7;
  ImportEnumLite IVar8;
  TestAllTypesLite_NestedEnum TVar9;
  ForeignEnumLite FVar10;
  OneofFieldCase OVar11;
  RepeatedField<int> *pRVar12;
  size_t sVar13;
  size_t sVar14;
  RepeatedField<long> *pRVar15;
  size_t sVar16;
  size_t sVar17;
  RepeatedField<unsigned_int> *value;
  size_t sVar18;
  size_t sVar19;
  RepeatedField<unsigned_long> *value_00;
  size_t sVar20;
  size_t sVar21;
  size_t sVar22;
  size_t sVar23;
  size_t sVar24;
  size_t sVar25;
  size_t sVar26;
  size_t sVar27;
  size_t sVar28;
  size_t sVar29;
  size_t sVar30;
  size_t sVar31;
  size_t sVar32;
  size_t sVar33;
  size_t sVar34;
  size_t sVar35;
  size_t sVar36;
  size_t sVar37;
  size_t sVar38;
  size_t sVar39;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar40;
  size_t sVar41;
  const_reference pbVar42;
  RepeatedPtrField<proto2_unittest::TestAllTypesLite_RepeatedGroup> *this_00;
  reference value_01;
  RepeatedPtrField<proto2_unittest::TestAllTypesLite_NestedMessage> *pRVar43;
  RepeatedPtrField<proto2_unittest::ForeignMessageLite> *this_01;
  reference value_02;
  RepeatedPtrField<proto2_unittest_import::ImportMessageLite> *this_02;
  reference value_03;
  reference pTVar44;
  uint32_t *puVar45;
  string *psVar46;
  int64_t iVar47;
  uint64_t uVar48;
  Cord *value_04;
  long lVar49;
  TestAllTypesLite_NestedMessage *msg_4;
  const_iterator __end2_4;
  const_iterator __begin2_4;
  RepeatedPtrField<proto2_unittest::TestAllTypesLite_NestedMessage> *__range2_4;
  int n_3;
  int i_3;
  int n_2;
  int i_2;
  size_t tag_size_15;
  size_t data_size_15;
  size_t tag_size_14;
  size_t data_size_14;
  size_t tag_size_13;
  size_t data_size_13;
  ImportMessageLite *msg_3;
  const_iterator __end2_3;
  const_iterator __begin2_3;
  RepeatedPtrField<proto2_unittest_import::ImportMessageLite> *__range2_3;
  ForeignMessageLite *msg_2;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  RepeatedPtrField<proto2_unittest::ForeignMessageLite> *__range2_2;
  TestAllTypesLite_NestedMessage *msg_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  RepeatedPtrField<proto2_unittest::TestAllTypesLite_NestedMessage> *__range2_1;
  TestAllTypesLite_RepeatedGroup *msg;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<proto2_unittest::TestAllTypesLite_RepeatedGroup> *__range2;
  int n_1;
  int i_1;
  int n;
  int i;
  size_t tag_size_12;
  size_t data_size_12;
  size_t tag_size_11;
  size_t data_size_11;
  size_t tag_size_10;
  size_t data_size_10;
  size_t tag_size_9;
  size_t data_size_9;
  size_t tag_size_8;
  size_t data_size_8;
  size_t tag_size_7;
  size_t data_size_7;
  size_t tag_size_6;
  size_t data_size_6;
  size_t tag_size_5;
  size_t data_size_5;
  size_t tag_size_4;
  size_t data_size_4;
  size_t tag_size_3;
  size_t data_size_3;
  size_t tag_size_2;
  size_t data_size_2;
  size_t tag_size_1;
  size_t data_size_1;
  size_t tag_size;
  size_t data_size;
  size_t sStack_58;
  uint32_t cached_has_bits;
  size_t total_size;
  TestAllTypesLite *this_;
  TestAllTypesLite *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  pRVar12 = _internal_repeated_int32(this);
  sVar13 = google::protobuf::internal::WireFormatLite::Int32Size(pRVar12);
  iVar3 = _internal_repeated_int32_size(this);
  sVar14 = google::protobuf::internal::FromIntSize(iVar3);
  pRVar15 = _internal_repeated_int64(this);
  sVar16 = google::protobuf::internal::WireFormatLite::Int64Size(pRVar15);
  iVar3 = _internal_repeated_int64_size(this);
  sVar17 = google::protobuf::internal::FromIntSize(iVar3);
  value = _internal_repeated_uint32(this);
  sVar18 = google::protobuf::internal::WireFormatLite::UInt32Size(value);
  iVar3 = _internal_repeated_uint32_size(this);
  sVar19 = google::protobuf::internal::FromIntSize(iVar3);
  value_00 = _internal_repeated_uint64(this);
  sVar20 = google::protobuf::internal::WireFormatLite::UInt64Size(value_00);
  iVar3 = _internal_repeated_uint64_size(this);
  sVar21 = google::protobuf::internal::FromIntSize(iVar3);
  pRVar12 = _internal_repeated_sint32(this);
  sVar22 = google::protobuf::internal::WireFormatLite::SInt32Size(pRVar12);
  iVar3 = _internal_repeated_sint32_size(this);
  sVar23 = google::protobuf::internal::FromIntSize(iVar3);
  pRVar15 = _internal_repeated_sint64(this);
  sVar24 = google::protobuf::internal::WireFormatLite::SInt64Size(pRVar15);
  iVar3 = _internal_repeated_sint64_size(this);
  sVar25 = google::protobuf::internal::FromIntSize(iVar3);
  iVar3 = _internal_repeated_fixed32_size(this);
  sVar26 = google::protobuf::internal::FromIntSize(iVar3);
  iVar3 = _internal_repeated_fixed32_size(this);
  sVar27 = google::protobuf::internal::FromIntSize(iVar3);
  iVar3 = _internal_repeated_fixed64_size(this);
  sVar28 = google::protobuf::internal::FromIntSize(iVar3);
  iVar3 = _internal_repeated_fixed64_size(this);
  sVar29 = google::protobuf::internal::FromIntSize(iVar3);
  iVar3 = _internal_repeated_sfixed32_size(this);
  sVar30 = google::protobuf::internal::FromIntSize(iVar3);
  iVar3 = _internal_repeated_sfixed32_size(this);
  sVar31 = google::protobuf::internal::FromIntSize(iVar3);
  iVar3 = _internal_repeated_sfixed64_size(this);
  sVar32 = google::protobuf::internal::FromIntSize(iVar3);
  iVar3 = _internal_repeated_sfixed64_size(this);
  sVar33 = google::protobuf::internal::FromIntSize(iVar3);
  iVar3 = _internal_repeated_float_size(this);
  sVar34 = google::protobuf::internal::FromIntSize(iVar3);
  iVar3 = _internal_repeated_float_size(this);
  sVar35 = google::protobuf::internal::FromIntSize(iVar3);
  iVar3 = _internal_repeated_double_size(this);
  sVar36 = google::protobuf::internal::FromIntSize(iVar3);
  iVar3 = _internal_repeated_double_size(this);
  sVar37 = google::protobuf::internal::FromIntSize(iVar3);
  iVar3 = _internal_repeated_bool_size(this);
  sVar38 = google::protobuf::internal::FromIntSize(iVar3);
  iVar3 = _internal_repeated_bool_size(this);
  sVar39 = google::protobuf::internal::FromIntSize(iVar3);
  pRVar40 = _internal_repeated_string_abi_cxx11_(this);
  iVar3 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(pRVar40);
  sVar41 = google::protobuf::internal::FromIntSize(iVar3);
  sStack_58 = sVar41 * 2 +
              sVar39 * 2 + sVar38 +
              sVar37 * 2 + sVar36 * 8 +
              sVar35 * 2 + sVar34 * 4 +
              sVar33 * 2 + sVar32 * 8 +
              sVar31 * 2 + sVar30 * 4 +
              sVar29 * 2 + sVar28 * 8 +
              sVar27 * 2 + sVar26 * 4 +
              sVar25 * 2 + sVar24 +
              sVar23 * 2 + sVar22 +
              sVar21 * 2 + sVar20 + sVar19 * 2 + sVar18 + sVar17 * 2 + sVar16 + sVar14 * 2 + sVar13;
  i_1 = 0;
  pRVar40 = _internal_repeated_string_abi_cxx11_(this);
  iVar3 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(pRVar40);
  for (; i_1 < iVar3; i_1 = i_1 + 1) {
    pRVar40 = _internal_repeated_string_abi_cxx11_(this);
    pbVar42 = google::protobuf::
              RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::Get(pRVar40,i_1);
    sVar13 = google::protobuf::internal::WireFormatLite::StringSize(pbVar42);
    sStack_58 = sVar13 + sStack_58;
  }
  pRVar40 = _internal_repeated_bytes_abi_cxx11_(this);
  iVar3 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(pRVar40);
  sVar13 = google::protobuf::internal::FromIntSize(iVar3);
  sStack_58 = sVar13 * 2 + sStack_58;
  __range2._4_4_ = 0;
  pRVar40 = _internal_repeated_bytes_abi_cxx11_(this);
  iVar3 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(pRVar40);
  for (; __range2._4_4_ < iVar3; __range2._4_4_ = __range2._4_4_ + 1) {
    pRVar40 = _internal_repeated_bytes_abi_cxx11_(this);
    pbVar42 = google::protobuf::
              RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::Get(pRVar40,__range2._4_4_);
    sVar13 = google::protobuf::internal::WireFormatLite::BytesSize(pbVar42);
    sStack_58 = sVar13 + sStack_58;
  }
  iVar3 = _internal_repeatedgroup_size(this);
  sStack_58 = (long)iVar3 * 4 + sStack_58;
  this_00 = _internal_repeatedgroup(this);
  __end2 = google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypesLite_RepeatedGroup>::
           begin(this_00);
  msg = (TestAllTypesLite_RepeatedGroup *)
        google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypesLite_RepeatedGroup>::end
                  (this_00);
  while (bVar2 = google::protobuf::internal::operator!=(&__end2,(iterator *)&msg), bVar2) {
    value_01 = google::protobuf::internal::
               RepeatedPtrIterator<const_proto2_unittest::TestAllTypesLite_RepeatedGroup>::operator*
                         (&__end2);
    sVar13 = google::protobuf::internal::WireFormatLite::
             GroupSize<proto2_unittest::TestAllTypesLite_RepeatedGroup>(value_01);
    sStack_58 = sVar13 + sStack_58;
    google::protobuf::internal::
    RepeatedPtrIterator<const_proto2_unittest::TestAllTypesLite_RepeatedGroup>::operator++(&__end2);
  }
  iVar3 = _internal_repeated_nested_message_size(this);
  sStack_58 = (long)iVar3 * 2 + sStack_58;
  pRVar43 = _internal_repeated_nested_message(this);
  __end2_1 = google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypesLite_NestedMessage>::
             begin(pRVar43);
  msg_1 = (TestAllTypesLite_NestedMessage *)
          google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypesLite_NestedMessage>::end
                    (pRVar43);
  while (bVar2 = google::protobuf::internal::operator!=(&__end2_1,(iterator *)&msg_1), bVar2) {
    pTVar44 = google::protobuf::internal::
              RepeatedPtrIterator<const_proto2_unittest::TestAllTypesLite_NestedMessage>::operator*
                        (&__end2_1);
    sVar13 = google::protobuf::internal::WireFormatLite::
             MessageSize<proto2_unittest::TestAllTypesLite_NestedMessage>(pTVar44);
    sStack_58 = sVar13 + sStack_58;
    google::protobuf::internal::
    RepeatedPtrIterator<const_proto2_unittest::TestAllTypesLite_NestedMessage>::operator++
              (&__end2_1);
  }
  iVar3 = _internal_repeated_foreign_message_size(this);
  sStack_58 = (long)iVar3 * 2 + sStack_58;
  this_01 = _internal_repeated_foreign_message(this);
  __end2_2 = google::protobuf::RepeatedPtrField<proto2_unittest::ForeignMessageLite>::begin(this_01)
  ;
  msg_2 = (ForeignMessageLite *)
          google::protobuf::RepeatedPtrField<proto2_unittest::ForeignMessageLite>::end(this_01);
  while (bVar2 = google::protobuf::internal::operator!=(&__end2_2,(iterator *)&msg_2), bVar2) {
    value_02 = google::protobuf::internal::
               RepeatedPtrIterator<const_proto2_unittest::ForeignMessageLite>::operator*(&__end2_2);
    sVar13 = google::protobuf::internal::WireFormatLite::
             MessageSize<proto2_unittest::ForeignMessageLite>(value_02);
    sStack_58 = sVar13 + sStack_58;
    google::protobuf::internal::RepeatedPtrIterator<const_proto2_unittest::ForeignMessageLite>::
    operator++(&__end2_2);
  }
  iVar3 = _internal_repeated_import_message_size(this);
  sStack_58 = (long)iVar3 * 2 + sStack_58;
  this_02 = _internal_repeated_import_message(this);
  __end2_3 = google::protobuf::RepeatedPtrField<proto2_unittest_import::ImportMessageLite>::begin
                       (this_02);
  msg_3 = (ImportMessageLite *)
          google::protobuf::RepeatedPtrField<proto2_unittest_import::ImportMessageLite>::end
                    (this_02);
  while (bVar2 = google::protobuf::internal::operator!=(&__end2_3,(iterator *)&msg_3), bVar2) {
    value_03 = google::protobuf::internal::
               RepeatedPtrIterator<const_proto2_unittest_import::ImportMessageLite>::operator*
                         (&__end2_3);
    sVar13 = google::protobuf::internal::WireFormatLite::
             MessageSize<proto2_unittest_import::ImportMessageLite>(value_03);
    sStack_58 = sVar13 + sStack_58;
    google::protobuf::internal::RepeatedPtrIterator<const_proto2_unittest_import::ImportMessageLite>
    ::operator++(&__end2_3);
  }
  pRVar12 = _internal_repeated_nested_enum(this);
  sVar13 = google::protobuf::internal::WireFormatLite::EnumSize(pRVar12);
  iVar3 = _internal_repeated_nested_enum_size(this);
  sVar14 = google::protobuf::internal::FromIntSize(iVar3);
  pRVar12 = _internal_repeated_foreign_enum(this);
  sVar16 = google::protobuf::internal::WireFormatLite::EnumSize(pRVar12);
  iVar3 = _internal_repeated_foreign_enum_size(this);
  sVar17 = google::protobuf::internal::FromIntSize(iVar3);
  pRVar12 = _internal_repeated_import_enum(this);
  sVar18 = google::protobuf::internal::WireFormatLite::EnumSize(pRVar12);
  iVar3 = _internal_repeated_import_enum_size(this);
  sVar19 = google::protobuf::internal::FromIntSize(iVar3);
  pRVar40 = _internal_repeated_string_piece_abi_cxx11_(this);
  iVar3 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(pRVar40);
  sVar20 = google::protobuf::internal::FromIntSize(iVar3);
  sStack_58 = sVar20 * 2 +
              sVar18 + sVar19 * 2 + sVar16 + sVar17 * 2 + sVar13 + sVar14 * 2 + sStack_58;
  i_3 = 0;
  pRVar40 = _internal_repeated_string_piece_abi_cxx11_(this);
  iVar3 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(pRVar40);
  for (; i_3 < iVar3; i_3 = i_3 + 1) {
    pRVar40 = _internal_repeated_string_piece_abi_cxx11_(this);
    pbVar42 = google::protobuf::
              RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::Get(pRVar40,i_3);
    sVar13 = google::protobuf::internal::WireFormatLite::StringSize(pbVar42);
    sStack_58 = sVar13 + sStack_58;
  }
  pRVar40 = _internal_repeated_cord_abi_cxx11_(this);
  iVar3 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(pRVar40);
  sVar13 = google::protobuf::internal::FromIntSize(iVar3);
  sStack_58 = sVar13 * 2 + sStack_58;
  __range2_4._4_4_ = 0;
  pRVar40 = _internal_repeated_cord_abi_cxx11_(this);
  iVar3 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(pRVar40);
  for (; __range2_4._4_4_ < iVar3; __range2_4._4_4_ = __range2_4._4_4_ + 1) {
    pRVar40 = _internal_repeated_cord_abi_cxx11_(this);
    pbVar42 = google::protobuf::
              RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::Get(pRVar40,__range2_4._4_4_);
    sVar13 = google::protobuf::internal::WireFormatLite::StringSize(pbVar42);
    sStack_58 = sVar13 + sStack_58;
  }
  iVar3 = _internal_repeated_lazy_message_size(this);
  sStack_58 = (long)iVar3 * 2 + sStack_58;
  pRVar43 = _internal_repeated_lazy_message(this);
  __end2_4 = google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypesLite_NestedMessage>::
             begin(pRVar43);
  msg_4 = (TestAllTypesLite_NestedMessage *)
          google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypesLite_NestedMessage>::end
                    (pRVar43);
  while (bVar2 = google::protobuf::internal::operator!=(&__end2_4,(iterator *)&msg_4), bVar2) {
    pTVar44 = google::protobuf::internal::
              RepeatedPtrIterator<const_proto2_unittest::TestAllTypesLite_NestedMessage>::operator*
                        (&__end2_4);
    sVar13 = google::protobuf::internal::WireFormatLite::
             MessageSize<proto2_unittest::TestAllTypesLite_NestedMessage>(pTVar44);
    sStack_58 = sVar13 + sStack_58;
    google::protobuf::internal::
    RepeatedPtrIterator<const_proto2_unittest::TestAllTypesLite_NestedMessage>::operator++
              (&__end2_4);
  }
  puVar45 = google::protobuf::internal::HasBits<2>::operator[](&(this->field_0)._impl_._has_bits_,0)
  ;
  uVar1 = *puVar45;
  tVar4 = absl::lts_20250127::popcount<unsigned_int>(uVar1 & 0x4c0000);
  tVar5 = absl::lts_20250127::popcount<unsigned_int>(uVar1 & 0x320000);
  sStack_58 = (long)(int)((uint)((uVar1 & 0x800000) != 0) << 1) +
              (long)(tVar5 * 5) + (long)(tVar4 * 9) + sStack_58;
  if ((uVar1 & 0xff) != 0) {
    if ((uVar1 & 1) != 0) {
      psVar46 = _internal_optional_string_abi_cxx11_(this);
      sVar13 = google::protobuf::internal::WireFormatLite::StringSize(psVar46);
      sStack_58 = sVar13 + 1 + sStack_58;
    }
    if ((uVar1 & 2) != 0) {
      psVar46 = _internal_optional_bytes_abi_cxx11_(this);
      sVar13 = google::protobuf::internal::WireFormatLite::BytesSize(psVar46);
      sStack_58 = sVar13 + 1 + sStack_58;
    }
    if ((uVar1 & 4) != 0) {
      psVar46 = _internal_optional_string_piece_abi_cxx11_(this);
      sVar13 = google::protobuf::internal::WireFormatLite::StringSize(psVar46);
      sStack_58 = sVar13 + 2 + sStack_58;
    }
    if ((uVar1 & 8) != 0) {
      psVar46 = _internal_optional_cord_abi_cxx11_(this);
      sVar13 = google::protobuf::internal::WireFormatLite::StringSize(psVar46);
      sStack_58 = sVar13 + 2 + sStack_58;
    }
    if ((uVar1 & 0x10) != 0) {
      sVar13 = google::protobuf::internal::WireFormatLite::
               GroupSize<proto2_unittest::TestAllTypesLite_OptionalGroup>
                         ((this->field_0)._impl_.optionalgroup_);
      sStack_58 = sVar13 + 4 + sStack_58;
    }
    if ((uVar1 & 0x20) != 0) {
      sVar13 = google::protobuf::internal::WireFormatLite::
               MessageSize<proto2_unittest::TestAllTypesLite_NestedMessage>
                         ((this->field_0)._impl_.optional_nested_message_);
      sStack_58 = sVar13 + 2 + sStack_58;
    }
    if ((uVar1 & 0x40) != 0) {
      sVar13 = google::protobuf::internal::WireFormatLite::
               MessageSize<proto2_unittest::ForeignMessageLite>
                         ((this->field_0)._impl_.optional_foreign_message_);
      sStack_58 = sVar13 + 2 + sStack_58;
    }
    if ((uVar1 & 0x80) != 0) {
      sVar13 = google::protobuf::internal::WireFormatLite::
               MessageSize<proto2_unittest_import::ImportMessageLite>
                         ((this->field_0)._impl_.optional_import_message_);
      sStack_58 = sVar13 + 2 + sStack_58;
    }
  }
  if ((uVar1 & 0xff00) != 0) {
    if ((uVar1 & 0x100) != 0) {
      sVar13 = google::protobuf::internal::WireFormatLite::
               MessageSize<proto2_unittest_import::PublicImportMessageLite>
                         ((this->field_0)._impl_.optional_public_import_message_);
      sStack_58 = sVar13 + 2 + sStack_58;
    }
    if ((uVar1 & 0x200) != 0) {
      sVar13 = google::protobuf::internal::WireFormatLite::
               MessageSize<proto2_unittest::TestAllTypesLite_NestedMessage>
                         ((this->field_0)._impl_.optional_lazy_message_);
      sStack_58 = sVar13 + 2 + sStack_58;
    }
    if ((uVar1 & 0x400) != 0) {
      sVar13 = google::protobuf::internal::WireFormatLite::
               MessageSize<proto2_unittest::TestAllTypesLite_NestedMessage>
                         ((this->field_0)._impl_.optional_unverified_lazy_message_);
      sStack_58 = sVar13 + 2 + sStack_58;
    }
    if ((uVar1 & 0x800) != 0) {
      iVar47 = _internal_optional_int64(this);
      sVar13 = google::protobuf::internal::WireFormatLite::Int64SizePlusOne(iVar47);
      sStack_58 = sVar13 + sStack_58;
    }
    if ((uVar1 & 0x1000) != 0) {
      iVar6 = _internal_optional_int32(this);
      sVar13 = google::protobuf::internal::WireFormatLite::Int32SizePlusOne(iVar6);
      sStack_58 = sVar13 + sStack_58;
    }
    if ((uVar1 & 0x2000) != 0) {
      uVar7 = _internal_optional_uint32(this);
      sVar13 = google::protobuf::internal::WireFormatLite::UInt32SizePlusOne(uVar7);
      sStack_58 = sVar13 + sStack_58;
    }
    if ((uVar1 & 0x4000) != 0) {
      uVar48 = _internal_optional_uint64(this);
      sVar13 = google::protobuf::internal::WireFormatLite::UInt64SizePlusOne(uVar48);
      sStack_58 = sVar13 + sStack_58;
    }
    if ((uVar1 & 0x8000) != 0) {
      iVar47 = _internal_optional_sint64(this);
      sVar13 = google::protobuf::internal::WireFormatLite::SInt64SizePlusOne(iVar47);
      sStack_58 = sVar13 + sStack_58;
    }
  }
  if ((uVar1 & 0x10000) != 0) {
    iVar6 = _internal_optional_sint32(this);
    sVar13 = google::protobuf::internal::WireFormatLite::SInt32SizePlusOne(iVar6);
    sStack_58 = sVar13 + sStack_58;
  }
  if ((uVar1 & 0xff000000) != 0) {
    if ((uVar1 & 0x1000000) != 0) {
      IVar8 = _internal_optional_import_enum(this);
      sVar13 = google::protobuf::internal::WireFormatLite::EnumSize(IVar8);
      sStack_58 = sVar13 + 2 + sStack_58;
    }
    if ((uVar1 & 0x2000000) != 0) {
      TVar9 = _internal_optional_nested_enum(this);
      sVar13 = google::protobuf::internal::WireFormatLite::EnumSize(TVar9);
      sStack_58 = sVar13 + 2 + sStack_58;
    }
    if ((uVar1 & 0x4000000) != 0) {
      FVar10 = _internal_optional_foreign_enum(this);
      sVar13 = google::protobuf::internal::WireFormatLite::EnumSize(FVar10);
      sStack_58 = sVar13 + 2 + sStack_58;
    }
    if ((uVar1 & 0x8000000) != 0) {
      psVar46 = _internal_default_string_abi_cxx11_(this);
      sVar13 = google::protobuf::internal::WireFormatLite::StringSize(psVar46);
      sStack_58 = sVar13 + 2 + sStack_58;
    }
    if ((uVar1 & 0x10000000) != 0) {
      psVar46 = _internal_default_bytes_abi_cxx11_(this);
      sVar13 = google::protobuf::internal::WireFormatLite::BytesSize(psVar46);
      sStack_58 = sVar13 + 2 + sStack_58;
    }
    if ((uVar1 & 0x20000000) != 0) {
      psVar46 = _internal_default_string_piece_abi_cxx11_(this);
      sVar13 = google::protobuf::internal::WireFormatLite::StringSize(psVar46);
      sStack_58 = sVar13 + 2 + sStack_58;
    }
    if ((uVar1 & 0x40000000) != 0) {
      psVar46 = _internal_default_cord_abi_cxx11_(this);
      sVar13 = google::protobuf::internal::WireFormatLite::StringSize(psVar46);
      sStack_58 = sVar13 + 2 + sStack_58;
    }
    if ((uVar1 & 0x80000000) != 0) {
      value_04 = _internal_optional_bytes_cord(this);
      sVar13 = google::protobuf::internal::WireFormatLite::BytesSize(value_04);
      sStack_58 = sVar13 + 2 + sStack_58;
    }
  }
  puVar45 = google::protobuf::internal::HasBits<2>::operator[](&(this->field_0)._impl_._has_bits_,1)
  ;
  uVar1 = *puVar45;
  tVar4 = absl::lts_20250127::popcount<unsigned_int>(uVar1 & 0x1300);
  tVar5 = absl::lts_20250127::popcount<unsigned_int>(uVar1 & 0xc80);
  sStack_58 = (long)(int)((uint)((uVar1 & 0x2000) != 0) * 3) +
              (long)(tVar5 * 6) + (long)(tVar4 * 10) + sStack_58;
  if ((uVar1 & 0x7f) != 0) {
    if ((uVar1 & 1) != 0) {
      iVar6 = _internal_deceptively_named_list(this);
      sVar13 = google::protobuf::internal::WireFormatLite::Int32Size(iVar6);
      sStack_58 = sVar13 + 2 + sStack_58;
    }
    if ((uVar1 & 2) != 0) {
      iVar47 = _internal_default_int64(this);
      sVar13 = google::protobuf::internal::WireFormatLite::Int64Size(iVar47);
      sStack_58 = sVar13 + 2 + sStack_58;
    }
    if ((uVar1 & 4) != 0) {
      iVar6 = _internal_default_int32(this);
      sVar13 = google::protobuf::internal::WireFormatLite::Int32Size(iVar6);
      sStack_58 = sVar13 + 2 + sStack_58;
    }
    if ((uVar1 & 8) != 0) {
      uVar7 = _internal_default_uint32(this);
      sVar13 = google::protobuf::internal::WireFormatLite::UInt32Size(uVar7);
      sStack_58 = sVar13 + 2 + sStack_58;
    }
    if ((uVar1 & 0x10) != 0) {
      uVar48 = _internal_default_uint64(this);
      sVar13 = google::protobuf::internal::WireFormatLite::UInt64Size(uVar48);
      sStack_58 = sVar13 + 2 + sStack_58;
    }
    if ((uVar1 & 0x20) != 0) {
      iVar47 = _internal_default_sint64(this);
      sVar13 = google::protobuf::internal::WireFormatLite::SInt64Size(iVar47);
      sStack_58 = sVar13 + 2 + sStack_58;
    }
    if ((uVar1 & 0x40) != 0) {
      iVar6 = _internal_default_sint32(this);
      sVar13 = google::protobuf::internal::WireFormatLite::SInt32Size(iVar6);
      sStack_58 = sVar13 + 2 + sStack_58;
    }
  }
  if ((uVar1 & 0xc000) != 0) {
    if ((uVar1 & 0x4000) != 0) {
      TVar9 = _internal_default_nested_enum(this);
      sVar13 = google::protobuf::internal::WireFormatLite::EnumSize(TVar9);
      sStack_58 = sVar13 + 2 + sStack_58;
    }
    if ((uVar1 & 0x8000) != 0) {
      FVar10 = _internal_default_foreign_enum(this);
      sVar13 = google::protobuf::internal::WireFormatLite::EnumSize(FVar10);
      sStack_58 = sVar13 + 2 + sStack_58;
    }
  }
  if ((uVar1 & 0x10000) != 0) {
    IVar8 = _internal_default_import_enum(this);
    sVar13 = google::protobuf::internal::WireFormatLite::EnumSize(IVar8);
    sStack_58 = sVar13 + 2 + sStack_58;
  }
  OVar11 = oneof_field_case(this);
  if (OVar11 != ONEOF_FIELD_NOT_SET) {
    if (OVar11 == kOneofUint32) {
      uVar7 = _internal_oneof_uint32(this);
      sVar13 = google::protobuf::internal::WireFormatLite::UInt32Size(uVar7);
      sStack_58 = sVar13 + 2 + sStack_58;
    }
    else if (OVar11 == kOneofNestedMessage) {
      sVar13 = google::protobuf::internal::WireFormatLite::
               MessageSize<google::protobuf::MessageLite>
                         ((this->field_0)._impl_.oneof_field_.oneof_nested_message_);
      sStack_58 = sVar13 + 2 + sStack_58;
    }
    else if (OVar11 == kOneofString) {
      psVar46 = _internal_oneof_string_abi_cxx11_(this);
      sVar13 = google::protobuf::internal::WireFormatLite::StringSize(psVar46);
      sStack_58 = sVar13 + 2 + sStack_58;
    }
    else if (OVar11 == kOneofBytes) {
      psVar46 = _internal_oneof_bytes_abi_cxx11_(this);
      sVar13 = google::protobuf::internal::WireFormatLite::BytesSize(psVar46);
      sStack_58 = sVar13 + 2 + sStack_58;
    }
    else if (OVar11 == kOneofLazyNestedMessage) {
      sVar13 = google::protobuf::internal::WireFormatLite::
               MessageSize<google::protobuf::MessageLite>
                         ((this->field_0)._impl_.oneof_field_.oneof_nested_message_);
      sStack_58 = sVar13 + 2 + sStack_58;
    }
    else if (OVar11 == kOneofNestedMessage2) {
      sVar13 = google::protobuf::internal::WireFormatLite::
               MessageSize<google::protobuf::MessageLite>
                         ((this->field_0)._impl_.oneof_field_.oneof_nested_message_);
      sStack_58 = sVar13 + 2 + sStack_58;
    }
  }
  bVar2 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar2) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    lVar49 = std::__cxx11::string::size();
    sStack_58 = lVar49 + sStack_58;
  }
  iVar3 = google::protobuf::internal::ToCachedSize(sStack_58);
  google::protobuf::internal::CachedSize::Set(&(this->field_0)._impl_._cached_size_,iVar3);
  return sStack_58;
}

Assistant:

::size_t TestAllTypesLite::ByteSizeLong() const {
  const TestAllTypesLite& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.TestAllTypesLite)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated int32 repeated_int32 = 31;
    {
      ::size_t data_size = ::_pbi::WireFormatLite::Int32Size(
          this_._internal_repeated_int32());
      ::size_t tag_size = ::size_t{2} *
          ::_pbi::FromIntSize(this_._internal_repeated_int32_size());
      total_size += tag_size + data_size;
    }
    // repeated int64 repeated_int64 = 32;
    {
      ::size_t data_size = ::_pbi::WireFormatLite::Int64Size(
          this_._internal_repeated_int64());
      ::size_t tag_size = ::size_t{2} *
          ::_pbi::FromIntSize(this_._internal_repeated_int64_size());
      total_size += tag_size + data_size;
    }
    // repeated uint32 repeated_uint32 = 33;
    {
      ::size_t data_size = ::_pbi::WireFormatLite::UInt32Size(
          this_._internal_repeated_uint32());
      ::size_t tag_size = ::size_t{2} *
          ::_pbi::FromIntSize(this_._internal_repeated_uint32_size());
      total_size += tag_size + data_size;
    }
    // repeated uint64 repeated_uint64 = 34;
    {
      ::size_t data_size = ::_pbi::WireFormatLite::UInt64Size(
          this_._internal_repeated_uint64());
      ::size_t tag_size = ::size_t{2} *
          ::_pbi::FromIntSize(this_._internal_repeated_uint64_size());
      total_size += tag_size + data_size;
    }
    // repeated sint32 repeated_sint32 = 35;
    {
      ::size_t data_size = ::_pbi::WireFormatLite::SInt32Size(
          this_._internal_repeated_sint32());
      ::size_t tag_size = ::size_t{2} *
          ::_pbi::FromIntSize(this_._internal_repeated_sint32_size());
      total_size += tag_size + data_size;
    }
    // repeated sint64 repeated_sint64 = 36;
    {
      ::size_t data_size = ::_pbi::WireFormatLite::SInt64Size(
          this_._internal_repeated_sint64());
      ::size_t tag_size = ::size_t{2} *
          ::_pbi::FromIntSize(this_._internal_repeated_sint64_size());
      total_size += tag_size + data_size;
    }
    // repeated fixed32 repeated_fixed32 = 37;
    {
      ::size_t data_size = ::size_t{4} *
          ::_pbi::FromIntSize(this_._internal_repeated_fixed32_size());
      ::size_t tag_size = ::size_t{2} *
          ::_pbi::FromIntSize(this_._internal_repeated_fixed32_size());
      total_size += tag_size + data_size;
    }
    // repeated fixed64 repeated_fixed64 = 38;
    {
      ::size_t data_size = ::size_t{8} *
          ::_pbi::FromIntSize(this_._internal_repeated_fixed64_size());
      ::size_t tag_size = ::size_t{2} *
          ::_pbi::FromIntSize(this_._internal_repeated_fixed64_size());
      total_size += tag_size + data_size;
    }
    // repeated sfixed32 repeated_sfixed32 = 39;
    {
      ::size_t data_size = ::size_t{4} *
          ::_pbi::FromIntSize(this_._internal_repeated_sfixed32_size());
      ::size_t tag_size = ::size_t{2} *
          ::_pbi::FromIntSize(this_._internal_repeated_sfixed32_size());
      total_size += tag_size + data_size;
    }
    // repeated sfixed64 repeated_sfixed64 = 40;
    {
      ::size_t data_size = ::size_t{8} *
          ::_pbi::FromIntSize(this_._internal_repeated_sfixed64_size());
      ::size_t tag_size = ::size_t{2} *
          ::_pbi::FromIntSize(this_._internal_repeated_sfixed64_size());
      total_size += tag_size + data_size;
    }
    // repeated float repeated_float = 41;
    {
      ::size_t data_size = ::size_t{4} *
          ::_pbi::FromIntSize(this_._internal_repeated_float_size());
      ::size_t tag_size = ::size_t{2} *
          ::_pbi::FromIntSize(this_._internal_repeated_float_size());
      total_size += tag_size + data_size;
    }
    // repeated double repeated_double = 42;
    {
      ::size_t data_size = ::size_t{8} *
          ::_pbi::FromIntSize(this_._internal_repeated_double_size());
      ::size_t tag_size = ::size_t{2} *
          ::_pbi::FromIntSize(this_._internal_repeated_double_size());
      total_size += tag_size + data_size;
    }
    // repeated bool repeated_bool = 43;
    {
      ::size_t data_size = ::size_t{1} *
          ::_pbi::FromIntSize(this_._internal_repeated_bool_size());
      ::size_t tag_size = ::size_t{2} *
          ::_pbi::FromIntSize(this_._internal_repeated_bool_size());
      total_size += tag_size + data_size;
    }
    // repeated string repeated_string = 44;
    {
      total_size +=
          2 * ::google::protobuf::internal::FromIntSize(this_._internal_repeated_string().size());
      for (int i = 0, n = this_._internal_repeated_string().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
            this_._internal_repeated_string().Get(i));
      }
    }
    // repeated bytes repeated_bytes = 45;
    {
      total_size +=
          2 * ::google::protobuf::internal::FromIntSize(this_._internal_repeated_bytes().size());
      for (int i = 0, n = this_._internal_repeated_bytes().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::BytesSize(
            this_._internal_repeated_bytes().Get(i));
      }
    }
    // repeated .proto2_unittest.TestAllTypesLite.RepeatedGroup repeatedgroup = 46 [features = {
    {
      total_size += 4UL * this_._internal_repeatedgroup_size();
      for (const auto& msg : this_._internal_repeatedgroup()) {
        total_size += ::google::protobuf::internal::WireFormatLite::GroupSize(msg);
      }
    }
    // repeated .proto2_unittest.TestAllTypesLite.NestedMessage repeated_nested_message = 48;
    {
      total_size += 2UL * this_._internal_repeated_nested_message_size();
      for (const auto& msg : this_._internal_repeated_nested_message()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .proto2_unittest.ForeignMessageLite repeated_foreign_message = 49;
    {
      total_size += 2UL * this_._internal_repeated_foreign_message_size();
      for (const auto& msg : this_._internal_repeated_foreign_message()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .proto2_unittest_import.ImportMessageLite repeated_import_message = 50;
    {
      total_size += 2UL * this_._internal_repeated_import_message_size();
      for (const auto& msg : this_._internal_repeated_import_message()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .proto2_unittest.TestAllTypesLite.NestedEnum repeated_nested_enum = 51;
    {
      ::size_t data_size =
          ::_pbi::WireFormatLite::EnumSize(this_._internal_repeated_nested_enum());
      ::size_t tag_size = ::size_t{2} *
          ::_pbi::FromIntSize(this_._internal_repeated_nested_enum_size());
      total_size += data_size + tag_size;
    }
    // repeated .proto2_unittest.ForeignEnumLite repeated_foreign_enum = 52;
    {
      ::size_t data_size =
          ::_pbi::WireFormatLite::EnumSize(this_._internal_repeated_foreign_enum());
      ::size_t tag_size = ::size_t{2} *
          ::_pbi::FromIntSize(this_._internal_repeated_foreign_enum_size());
      total_size += data_size + tag_size;
    }
    // repeated .proto2_unittest_import.ImportEnumLite repeated_import_enum = 53;
    {
      ::size_t data_size =
          ::_pbi::WireFormatLite::EnumSize(this_._internal_repeated_import_enum());
      ::size_t tag_size = ::size_t{2} *
          ::_pbi::FromIntSize(this_._internal_repeated_import_enum_size());
      total_size += data_size + tag_size;
    }
    // repeated string repeated_string_piece = 54 [ctype = STRING_PIECE];
    {
      total_size +=
          2 * ::google::protobuf::internal::FromIntSize(this_._internal_repeated_string_piece().size());
      for (int i = 0, n = this_._internal_repeated_string_piece().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
            this_._internal_repeated_string_piece().Get(i));
      }
    }
    // repeated string repeated_cord = 55 [ctype = CORD];
    {
      total_size +=
          2 * ::google::protobuf::internal::FromIntSize(this_._internal_repeated_cord().size());
      for (int i = 0, n = this_._internal_repeated_cord().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
            this_._internal_repeated_cord().Get(i));
      }
    }
    // repeated .proto2_unittest.TestAllTypesLite.NestedMessage repeated_lazy_message = 57;
    {
      total_size += 2UL * this_._internal_repeated_lazy_message_size();
      for (const auto& msg : this_._internal_repeated_lazy_message()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  total_size += ::absl::popcount(0x004c0000u & cached_has_bits) * 9;
  total_size += ::absl::popcount(0x00320000u & cached_has_bits) * 5;
  total_size += static_cast<bool>(0x00800000u & cached_has_bits) * 2;
  if ((cached_has_bits & 0x000000ffu) != 0) {
    // string optional_string = 14;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_optional_string());
    }
    // bytes optional_bytes = 15;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::BytesSize(
                                      this_._internal_optional_bytes());
    }
    // string optional_string_piece = 24 [ctype = STRING_PIECE];
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_optional_string_piece());
    }
    // string optional_cord = 25 [ctype = CORD];
    if ((cached_has_bits & 0x00000008u) != 0) {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_optional_cord());
    }
    // .proto2_unittest.TestAllTypesLite.OptionalGroup optionalgroup = 16 [features = {
    if ((cached_has_bits & 0x00000010u) != 0) {
      total_size += 4 +
                    ::google::protobuf::internal::WireFormatLite::GroupSize(*this_._impl_.optionalgroup_);
    }
    // .proto2_unittest.TestAllTypesLite.NestedMessage optional_nested_message = 18;
    if ((cached_has_bits & 0x00000020u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.optional_nested_message_);
    }
    // .proto2_unittest.ForeignMessageLite optional_foreign_message = 19;
    if ((cached_has_bits & 0x00000040u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.optional_foreign_message_);
    }
    // .proto2_unittest_import.ImportMessageLite optional_import_message = 20;
    if ((cached_has_bits & 0x00000080u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.optional_import_message_);
    }
  }
  if ((cached_has_bits & 0x0000ff00u) != 0) {
    // .proto2_unittest_import.PublicImportMessageLite optional_public_import_message = 26;
    if ((cached_has_bits & 0x00000100u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.optional_public_import_message_);
    }
    // .proto2_unittest.TestAllTypesLite.NestedMessage optional_lazy_message = 27 [lazy = true];
    if ((cached_has_bits & 0x00000200u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.optional_lazy_message_);
    }
    // .proto2_unittest.TestAllTypesLite.NestedMessage optional_unverified_lazy_message = 28 [unverified_lazy = true];
    if ((cached_has_bits & 0x00000400u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.optional_unverified_lazy_message_);
    }
    // int64 optional_int64 = 2;
    if ((cached_has_bits & 0x00000800u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int64SizePlusOne(
          this_._internal_optional_int64());
    }
    // int32 optional_int32 = 1;
    if ((cached_has_bits & 0x00001000u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_optional_int32());
    }
    // uint32 optional_uint32 = 3;
    if ((cached_has_bits & 0x00002000u) != 0) {
      total_size += ::_pbi::WireFormatLite::UInt32SizePlusOne(
          this_._internal_optional_uint32());
    }
    // uint64 optional_uint64 = 4;
    if ((cached_has_bits & 0x00004000u) != 0) {
      total_size += ::_pbi::WireFormatLite::UInt64SizePlusOne(
          this_._internal_optional_uint64());
    }
    // sint64 optional_sint64 = 6;
    if ((cached_has_bits & 0x00008000u) != 0) {
      total_size += ::_pbi::WireFormatLite::SInt64SizePlusOne(
          this_._internal_optional_sint64());
    }
  }
   {
    // sint32 optional_sint32 = 5;
    if ((cached_has_bits & 0x00010000u) != 0) {
      total_size += ::_pbi::WireFormatLite::SInt32SizePlusOne(
          this_._internal_optional_sint32());
    }
  }
  if ((cached_has_bits & 0xff000000u) != 0) {
    // .proto2_unittest_import.ImportEnumLite optional_import_enum = 23;
    if ((cached_has_bits & 0x01000000u) != 0) {
      total_size += 2 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_optional_import_enum());
    }
    // .proto2_unittest.TestAllTypesLite.NestedEnum optional_nested_enum = 21;
    if ((cached_has_bits & 0x02000000u) != 0) {
      total_size += 2 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_optional_nested_enum());
    }
    // .proto2_unittest.ForeignEnumLite optional_foreign_enum = 22;
    if ((cached_has_bits & 0x04000000u) != 0) {
      total_size += 2 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_optional_foreign_enum());
    }
    // string default_string = 74 [default = "hello"];
    if ((cached_has_bits & 0x08000000u) != 0) {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_default_string());
    }
    // bytes default_bytes = 75 [default = "world"];
    if ((cached_has_bits & 0x10000000u) != 0) {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::BytesSize(
                                      this_._internal_default_bytes());
    }
    // string default_string_piece = 84 [default = "abc", ctype = STRING_PIECE];
    if ((cached_has_bits & 0x20000000u) != 0) {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_default_string_piece());
    }
    // string default_cord = 85 [default = "123", ctype = CORD];
    if ((cached_has_bits & 0x40000000u) != 0) {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_default_cord());
    }
    // bytes optional_bytes_cord = 86 [ctype = CORD];
    if ((cached_has_bits & 0x80000000u) != 0) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::BytesSize(
          this_._internal_optional_bytes_cord());
    }
  }
  cached_has_bits = this_._impl_._has_bits_[1];
  total_size += ::absl::popcount(0x00001300u & cached_has_bits) * 10;
  total_size += ::absl::popcount(0x00000c80u & cached_has_bits) * 6;
  total_size += static_cast<bool>(0x00002000u & cached_has_bits) * 3;
  if ((cached_has_bits & 0x0000007fu) != 0) {
    // int32 deceptively_named_list = 116;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::Int32Size(
                                      this_._internal_deceptively_named_list());
    }
    // int64 default_int64 = 62 [default = 42];
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::Int64Size(
                                      this_._internal_default_int64());
    }
    // int32 default_int32 = 61 [default = 41];
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::Int32Size(
                                      this_._internal_default_int32());
    }
    // uint32 default_uint32 = 63 [default = 43];
    if ((cached_has_bits & 0x00000008u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::UInt32Size(
                                      this_._internal_default_uint32());
    }
    // uint64 default_uint64 = 64 [default = 44];
    if ((cached_has_bits & 0x00000010u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::UInt64Size(
                                      this_._internal_default_uint64());
    }
    // sint64 default_sint64 = 66 [default = 46];
    if ((cached_has_bits & 0x00000020u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::SInt64Size(
                                      this_._internal_default_sint64());
    }
    // sint32 default_sint32 = 65 [default = -45];
    if ((cached_has_bits & 0x00000040u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::SInt32Size(
                                      this_._internal_default_sint32());
    }
  }
  if ((cached_has_bits & 0x0000c000u) != 0) {
    // .proto2_unittest.TestAllTypesLite.NestedEnum default_nested_enum = 81 [default = BAR];
    if ((cached_has_bits & 0x00004000u) != 0) {
      total_size += 2 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_default_nested_enum());
    }
    // .proto2_unittest.ForeignEnumLite default_foreign_enum = 82 [default = FOREIGN_LITE_BAR];
    if ((cached_has_bits & 0x00008000u) != 0) {
      total_size += 2 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_default_foreign_enum());
    }
  }
   {
    // .proto2_unittest_import.ImportEnumLite default_import_enum = 83 [default = IMPORT_LITE_BAR];
    if ((cached_has_bits & 0x00010000u) != 0) {
      total_size += 2 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_default_import_enum());
    }
  }
  switch (this_.oneof_field_case()) {
    // uint32 oneof_uint32 = 111;
    case kOneofUint32: {
      total_size += 2 + ::_pbi::WireFormatLite::UInt32Size(
                                      this_._internal_oneof_uint32());
      break;
    }
    // .proto2_unittest.TestAllTypesLite.NestedMessage oneof_nested_message = 112;
    case kOneofNestedMessage: {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.oneof_field_.oneof_nested_message_);
      break;
    }
    // string oneof_string = 113;
    case kOneofString: {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_oneof_string());
      break;
    }
    // bytes oneof_bytes = 114;
    case kOneofBytes: {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::BytesSize(
                                      this_._internal_oneof_bytes());
      break;
    }
    // .proto2_unittest.TestAllTypesLite.NestedMessage oneof_lazy_nested_message = 115 [lazy = true];
    case kOneofLazyNestedMessage: {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.oneof_field_.oneof_lazy_nested_message_);
      break;
    }
    // .proto2_unittest.TestAllTypesLite.NestedMessage2 oneof_nested_message2 = 117;
    case kOneofNestedMessage2: {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.oneof_field_.oneof_nested_message2_);
      break;
    }
    case ONEOF_FIELD_NOT_SET: {
      break;
    }
  }
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    total_size += this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).size();
  }
  this_._impl_._cached_size_.Set(::_pbi::ToCachedSize(total_size));
  return total_size;
}